

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O2

void __thiscall
Descriptor_CheckChecksum_Test::Descriptor_CheckChecksum_Test(Descriptor_CheckChecksum_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_006fdae8;
  return;
}

Assistant:

TEST(Descriptor, CheckChecksum) {
  std::string base_descriptor = "sh(wpkh([ef57314e/0'/0'/4']03d3f817091de0bbe51e19b53303b12e463f664894d49cb5bf5bb19c88fbc54d8d))";
  std::string success_descriptor = base_descriptor + "#euerft8t";
  std::string fail_descriptor = base_descriptor + "#euerfa8t";
  Descriptor desc;
  std::string desc_str = "";

  EXPECT_NO_THROW(desc = Descriptor::Parse(success_descriptor));
  EXPECT_NO_THROW(desc_str = desc.ToString());
  EXPECT_STREQ(desc_str.c_str(), success_descriptor.c_str());

  EXPECT_THROW((desc = Descriptor::Parse(fail_descriptor)), CfdException);

  EXPECT_NO_THROW(desc = Descriptor::Parse(base_descriptor));
  EXPECT_NO_THROW(desc_str = desc.ToString());
  EXPECT_STREQ(desc_str.c_str(), success_descriptor.c_str());
  try {
    auto key_list = desc.GetKeyDataAll();
    EXPECT_FALSE(key_list.empty());
    if (!key_list.empty()) {
      EXPECT_STREQ(key_list[0].ToString().c_str(),
        "[ef57314e/0'/0'/4']03d3f817091de0bbe51e19b53303b12e463f664894d49cb5bf5bb19c88fbc54d8d");
    }
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
  }
}